

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_enlist(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CClass *this;
  CHAR_DATA *ch_00;
  char *pcVar4;
  long lVar5;
  CHAR_DATA *ch_01;
  char arg [4608];
  char buf [4608];
  char local_2428 [4608];
  AFFECT_DATA local_1228 [44];
  
  iVar3 = get_skill(ch,(int)gsn_enlist);
  if (10 < iVar3) {
    sVar1 = ch->level;
    lVar5 = (long)gsn_enlist;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar3 = CClass::GetIndex(this);
    if (*(short *)(lVar5 * 0x60 + 0x44e788 + (long)iVar3 * 2) <= sVar1) {
      one_argument(argument,local_2428);
      bVar2 = is_affected(ch,(int)gsn_enlist);
      if (bVar2) {
        pcVar4 = "You haven\'t built up the nerve to recruit anyone else yet.\n\r";
      }
      else if (local_2428[0] == '\0') {
        pcVar4 = "Who do you wish to enlist as a follower?\n\r";
      }
      else {
        ch_00 = get_char_room(ch,local_2428);
        if (ch_00 == (CHAR_DATA *)0x0) {
          pcVar4 = "They aren\'t here.\n\r";
        }
        else if (ch_00 == ch) {
          pcVar4 = "You can\'t recruit yourself.\n\r";
        }
        else {
          bVar2 = is_npc(ch_00);
          ch_01 = char_list;
          if (bVar2) {
            while( true ) {
              if (ch_01 == (CHAR_DATA *)0x0) {
                iVar3 = (int)ch->level;
                bVar2 = is_good(ch);
                if (((bVar2) && (bVar2 = is_evil(ch_00), bVar2)) ||
                   ((bVar2 = is_evil(ch), bVar2 && (bVar2 = is_good(ch_00), bVar2)))) {
                  iVar3 = 0;
                }
                bVar2 = is_neutral(ch_00);
                if ((bVar2) || (bVar2 = is_neutral(ch), bVar2)) {
                  iVar3 = iVar3 + -4;
                }
                bVar2 = is_affected_by(ch_00,0x12);
                if (bVar2) {
                  iVar3 = 0;
                }
                if (iVar3 < ch_00->level + 8) {
                  iVar3 = 0;
                }
                bVar2 = saves_spell(iVar3,ch_00,0x10);
                if ((~bVar2 & iVar3 != 0) == 0) {
                  iVar3 = number_percent();
                  pcVar4 = "You couldn\'t recruit a mangy dog to your company!";
                  if (iVar3 < 0x32) {
                    pcVar4 = "I don\'t follow scum such as you!";
                  }
                  do_say(ch_00,pcVar4);
                  pcVar4 = pers(ch_00,ch);
                  sprintf((char *)local_1228,"Help! I\'m being attacked by %s!",pcVar4);
                  do_myell(ch,(char *)local_1228,ch_00);
                  multi_hit(ch_00,ch,-1);
                  return;
                }
                ch_00->leader = ch;
                ch_00->master = ch;
                init_affect(local_1228);
                local_1228[0].where = 0;
                local_1228[0].aftype = 1;
                local_1228[0].type = gsn_enlist;
                local_1228[0].modifier = 0;
                local_1228[0].level = ch->level;
                local_1228[0].bitvector[0]._2_1_ = local_1228[0].bitvector[0]._2_1_ | 4;
                local_1228[0].location = 0;
                local_1228[0].duration = local_1228[0].level;
                affect_to_char(ch_00,local_1228);
                local_1228[0].duration = 0xf;
                affect_to_char(ch,local_1228);
                act("$N salutes you and prepares to follow into combat.",ch,(void *)0x0,ch_00,3);
                act("$N salutes $n and falls into line with $s.",ch,(void *)0x0,ch_00,1);
                return;
              }
              bVar2 = is_affected(ch_01,(int)gsn_enlist);
              if ((bVar2) && (ch_01->master == ch)) break;
              ch_01 = ch_01->next;
            }
            pcVar4 = "You already have a devoted recruit following you.\n\r";
          }
          else {
            pcVar4 = "Why not just ask them to join you?\n\r";
          }
        }
      }
      send_to_char(pcVar4,ch);
      return;
    }
  }
  send_to_char("You do not have the skills required to enlist mercenary aid.\n\r",ch);
  return;
}

Assistant:

void do_enlist(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	int level;
	char buf[MAX_STRING_LENGTH];
	AFFECT_DATA af;
	int chance;
	CHAR_DATA *check;

	chance = get_skill(ch, gsn_enlist);

	if (chance <= 10 || ch->level < skill_table[gsn_enlist].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You do not have the skills required to enlist mercenary aid.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (is_affected(ch, gsn_enlist))
	{
		send_to_char("You haven't built up the nerve to recruit anyone else yet.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Who do you wish to enlist as a follower?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't recruit yourself.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		send_to_char("Why not just ask them to join you?\n\r", ch);
		return;
	}

	for (check = char_list; check != nullptr; check = check->next)
	{
		if (is_affected(check, gsn_enlist) && check->master == ch)
		{
			send_to_char("You already have a devoted recruit following you.\n\r", ch);
			return;
		}
	}

	level = ch->level;

	if ((is_good(ch) && is_evil(victim)) || (is_evil(ch) && is_good(victim)))
		level = 0;

	if (is_neutral(victim) || is_neutral(ch))
		level -= 4;

	if (is_affected_by(victim, AFF_CHARM))
		level = 0;

	if ((victim->level + 8) > level)
		level = 0;

	if (saves_spell(level, victim, DAM_OTHER) || level == 0)
	{
		if (number_percent() < 50)
			do_say(victim, "I don't follow scum such as you!");
		else
			do_say(victim, "You couldn't recruit a mangy dog to your company!");

		sprintf(buf, "Help! I'm being attacked by %s!", pers(victim, ch));
		do_myell(ch, buf, victim);
		multi_hit(victim, ch, TYPE_UNDEFINED);
		return;
	}

	victim->leader = ch;
	victim->master = ch;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SKILL;
	af.type = gsn_enlist;
	af.modifier = 0;
	af.level = ch->level;

	SET_BIT(af.bitvector, AFF_CHARM);

	af.duration = ch->level;
	af.location = 0;
	affect_to_char(victim, &af);

	af.duration = 15;
	affect_to_char(ch, &af);

	act("$N salutes you and prepares to follow into combat.", ch, 0, victim, TO_CHAR);
	act("$N salutes $n and falls into line with $s.", ch, 0, victim, TO_NOTVICT);
}